

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Int64Parameter::clear_AllowedValues(Int64Parameter *this)

{
  AllowedValuesCase AVar1;
  Int64Parameter *this_local;
  
  AVar1 = AllowedValues_case(this);
  if (AVar1 != ALLOWEDVALUES_NOT_SET) {
    if (AVar1 == kRange) {
      if ((this->AllowedValues_).range_ != (Int64Range *)0x0) {
        (*(((this->AllowedValues_).range_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((AVar1 == kSet) && ((this->AllowedValues_).range_ != (Int64Range *)0x0)) {
      (*(((this->AllowedValues_).range_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Int64Parameter::clear_AllowedValues() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Int64Parameter)
  switch (AllowedValues_case()) {
    case kRange: {
      delete AllowedValues_.range_;
      break;
    }
    case kSet: {
      delete AllowedValues_.set_;
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = ALLOWEDVALUES_NOT_SET;
}